

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::insert
          (SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs> *this,BindingMap *svBindings
          ,LeafData *ld)

{
  uint var_00;
  long *plVar1;
  UnresolvedSplitRecord obj;
  TermList ts;
  TermList ts_00;
  TermList ts_01;
  TermList val;
  Node *pNVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  IntermediateNode *pIVar6;
  ulong uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TermList *pTVar8;
  undefined4 extraout_var_01;
  Leaf *pLVar9;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *in_RSI;
  uint *in_RDI;
  Top TVar10;
  UnresolvedSplitRecord UVar11;
  Elem EVar12;
  Binding BVar13;
  Leaf *leaf_1;
  uint x;
  Term *t;
  Term *s;
  Stack<Kernel::TermList_*> subterms;
  TermList *ss;
  TermList *tt;
  Leaf *lnode;
  IntermediateNode *inode_2;
  Binding b;
  TermList *term_2;
  uint *var;
  StlIter __end3;
  StlIter __begin3;
  IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
  *__range3;
  BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
  remainingBindings;
  Node **pparent;
  TermList term;
  uint boundVar;
  IntermediateNode *inode;
  Node **nodePosition;
  IntermediateNode *newNode;
  Node *node;
  UnresolvedSplitRecord urr;
  bool wouldDescendIntoChild;
  TermList term_1;
  bool removeProblematicNode;
  Node *child;
  uint boundVar_1;
  UArrIntermediateNode *inode_1;
  bool canPostponeSplits;
  Leaf *leaf;
  Node **pnode;
  undefined4 in_stack_fffffffffffffae8;
  uint in_stack_fffffffffffffaec;
  TermList in_stack_fffffffffffffaf0;
  TermList in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb04;
  undefined1 in_stack_fffffffffffffb05;
  undefined1 in_stack_fffffffffffffb06;
  undefined1 in_stack_fffffffffffffb07;
  Term *in_stack_fffffffffffffb08;
  undefined7 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb17;
  Term *in_stack_fffffffffffffb18;
  Term *in_stack_fffffffffffffb20;
  int local_400;
  undefined1 local_3fc [52];
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *local_3c8;
  Entry *local_3c0;
  uint64_t local_3b8;
  UnresolvedSplitRecord local_3b0;
  uint local_39c;
  Entry *local_398;
  uint64_t local_390;
  Term *local_388;
  Term *local_380;
  Entry *local_378;
  uint64_t local_370;
  Stack<Kernel::TermList_*> local_368;
  TermList *local_348;
  Entry **local_340;
  undefined1 local_334 [52];
  Entry *local_300;
  Leaf *local_2f8;
  undefined8 local_2f0;
  uint local_2e8;
  undefined8 local_2e0;
  uint local_2d8;
  undefined8 local_2d0;
  uint local_2c8;
  Entry *local_2c0;
  IntermediateNode *local_2b8;
  uint local_2b0;
  Entry *local_2a8;
  uint64_t local_2a0;
  Binding local_298;
  TermList *local_288;
  uint *local_280;
  Elem local_278;
  undefined1 local_220 [8];
  undefined1 *local_218;
  BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
  local_210;
  undefined8 local_1f8;
  undefined4 local_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  undefined8 local_1d4;
  undefined4 local_1cc;
  uint *local_1c8;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> local_1c0;
  long *local_198;
  undefined8 local_190;
  undefined4 local_188;
  undefined8 local_180;
  undefined4 local_178;
  undefined8 local_16c;
  undefined4 local_164;
  undefined8 *local_160;
  uint64_t local_158;
  uint64_t local_150;
  IntermediateNode *local_148;
  Node *local_140;
  uint local_138;
  TermList local_130;
  uint64_t local_128;
  uint64_t local_120;
  UnresolvedSplitRecord local_118;
  undefined8 local_108;
  undefined4 local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  undefined8 local_e8;
  undefined4 local_e0;
  undefined1 local_d9;
  uint64_t local_d8;
  byte local_c1;
  Node *local_c0;
  undefined4 local_b4;
  Node *local_b0;
  byte local_a1;
  undefined1 local_a0 [68];
  undefined1 local_5c [52];
  Leaf *local_28;
  uint *local_20;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *local_10;
  
  local_20 = in_RDI + 2;
  local_10 = in_RSI;
  if (*(long *)local_20 == 0) {
    bVar3 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::isEmpty
                      (in_RSI);
    if (bVar3) {
      pLVar9 = createLeaf();
      local_28 = pLVar9;
      Inferences::ALASCA::SuperpositionConf::Lhs::Lhs
                ((Lhs *)in_stack_fffffffffffffaf0._content,
                 (Lhs *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      (*(pLVar9->super_Node)._vptr_Node[9])(pLVar9,local_5c);
      Inferences::ALASCA::SuperpositionConf::Lhs::~Lhs((Lhs *)0x494a5d);
      *(Leaf **)local_20 = local_28;
      return;
    }
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::getOneKey
              ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
               CONCAT17(in_stack_fffffffffffffb07,
                        CONCAT16(in_stack_fffffffffffffb06,
                                 CONCAT15(in_stack_fffffffffffffb05,
                                          CONCAT14(in_stack_fffffffffffffb04,
                                                   in_stack_fffffffffffffb00)))));
    pIVar6 = createIntermediateNode
                       (CONCAT13(in_stack_fffffffffffffb07,
                                 CONCAT12(in_stack_fffffffffffffb06,
                                          CONCAT11(in_stack_fffffffffffffb05,
                                                   in_stack_fffffffffffffb04))));
    *(IntermediateNode **)local_20 = pIVar6;
  }
  bVar3 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::isEmpty
                    (local_10);
  if (bVar3) {
    ensureLeafEfficiency((Leaf **)0x494ae2);
    plVar1 = *(long **)local_20;
    Inferences::ALASCA::SuperpositionConf::Lhs::Lhs
              ((Lhs *)in_stack_fffffffffffffaf0._content,
               (Lhs *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    (**(code **)(*plVar1 + 0x48))(plVar1,local_a0);
    Inferences::ALASCA::SuperpositionConf::Lhs::~Lhs((Lhs *)0x494b3a);
  }
  else {
    if ((insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::SuperpositionConf::Lhs)
         ::unresolvedSplits == '\0') &&
       (iVar5 = __cxa_guard_acquire(&insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::SuperpositionConf::Lhs)
                                     ::unresolvedSplits), iVar5 != 0)) {
      Lib::
      BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
      ::BinaryHeap(&insert::unresolvedSplits);
      __cxa_atexit(Lib::
                   BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                   ::~BinaryHeap,&insert::unresolvedSplits,&__dso_handle);
      __cxa_guard_release(&insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::SuperpositionConf::Lhs)
                           ::unresolvedSplits);
    }
    Lib::
    BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
    ::reset(&insert::unresolvedSplits);
LAB_00494bbf:
    do {
      local_a1 = 0;
      uVar7 = (**(code **)(**(long **)local_20 + 0x10))();
      if (((uVar7 & 1) == 0) && (iVar5 = (**(code **)(**(long **)local_20 + 0x28))(), iVar5 == 1)) {
        local_b0 = *(Node **)local_20;
        iVar5 = (*local_b0->_vptr_Node[4])();
        local_a1 = iVar5 == 1;
        if ((bool)local_a1) {
          local_b4 = *(undefined4 *)&local_b0[1]._vptr_Node;
          local_c0 = (Node *)local_b0[1]._term._content;
          local_c1 = 0;
          Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::find
                    ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                     in_stack_fffffffffffffb08,
                     (uint *)CONCAT17(in_stack_fffffffffffffb07,
                                      CONCAT16(in_stack_fffffffffffffb06,
                                               CONCAT15(in_stack_fffffffffffffb05,
                                                        CONCAT14(in_stack_fffffffffffffb04,
                                                                 in_stack_fffffffffffffb00)))));
          bVar3 = Lib::Option::operator_cast_to_bool((Option<Kernel::TermList_&> *)0x494cba);
          if (bVar3) {
            pTVar8 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                     ::get((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                            *)in_stack_fffffffffffffaf0._content,in_stack_fffffffffffffaec);
            pNVar2 = local_b0;
            local_d8 = pTVar8->_content;
            TVar10 = Kernel::TermList::top((TermList *)in_stack_fffffffffffffb20);
            local_108 = TVar10._inner._inner._0_8_;
            local_f0 = CONCAT31(local_f0._1_3_,TVar10._inner._inner._content[7]);
            local_e0 = local_f0;
            local_100 = local_f0;
            local_f8 = local_108;
            local_e8 = local_108;
            iVar5 = (*pNVar2->_vptr_Node[10])
                              (pNVar2,local_108,(ulong)TVar10._inner._inner._content[7],0);
            local_d9 = CONCAT44(extraout_var,iVar5) != 0;
            if (!(bool)local_d9) {
              local_c1 = 1;
            }
          }
          else {
            Node::term(local_c0);
            bVar3 = Kernel::TermList::isTerm((TermList *)0x494da5);
            if (bVar3) {
              Node::term(local_c0);
              Kernel::TermList::term((TermList *)0x494dc0);
              bVar3 = Kernel::Term::shared((Term *)0x494dc8);
              if (!bVar3) {
                local_a1 = 0;
                goto LAB_00494de2;
              }
            }
            local_c1 = 1;
          }
LAB_00494de2:
          if ((local_c1 & 1) != 0) {
            var_00 = *(uint *)&local_b0[1]._vptr_Node;
            pTVar8 = Node::term(local_c0);
            local_120 = pTVar8->_content;
            UnresolvedSplitRecord::UnresolvedSplitRecord(&local_118,var_00,(TermList)local_120);
            UVar11.original._content._0_4_ = in_stack_fffffffffffffb00;
            UVar11._0_8_ = in_stack_fffffffffffffaf8._content;
            UVar11.original._content._4_1_ = in_stack_fffffffffffffb04;
            UVar11.original._content._5_1_ = in_stack_fffffffffffffb05;
            UVar11.original._content._6_1_ = in_stack_fffffffffffffb06;
            UVar11.original._content._7_1_ = in_stack_fffffffffffffb07;
            Lib::
            BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
            ::insert((BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                      *)in_stack_fffffffffffffaf0._content,UVar11);
            pNVar2 = local_c0;
            pTVar8 = Node::term(local_b0);
            local_128 = pTVar8->_content;
            Node::setTerm(pNVar2,(TermList)local_128);
            *(Node **)local_20 = local_c0;
            IntermediateNode::makeEmpty((IntermediateNode *)in_stack_fffffffffffffaf0._content);
            if (local_b0 != (Node *)0x0) {
              (*local_b0->_vptr_Node[1])();
            }
            goto LAB_00494bbf;
          }
        }
      }
      else {
        local_a1 = 0;
      }
      bVar4 = Lib::
              BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
              ::isEmpty(&insert::unresolvedSplits);
      bVar3 = (local_a1 & 1) != 0;
      local_a1 = bVar3 || bVar4;
      if (!bVar3 && !bVar4) {
        while (bVar3 = Lib::
                       BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                       ::isEmpty(&insert::unresolvedSplits), ((bVar3 ^ 0xffU) & 1) != 0) {
          UVar11 = Lib::
                   BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                   ::pop((BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                          *)in_stack_fffffffffffffaf0._content);
          local_130 = UVar11.original._content;
          local_138 = UVar11.var;
          local_140 = *(Node **)local_20;
          pTVar8 = Node::term(local_140);
          local_150 = pTVar8->_content;
          ts_00._content._7_1_ = in_stack_fffffffffffffb17;
          ts_00._content._0_7_ = in_stack_fffffffffffffb10;
          local_148 = createIntermediateNode(ts_00,(uint)((ulong)in_stack_fffffffffffffb08 >> 0x20))
          ;
          local_158 = local_130._content;
          Node::setTerm(local_140,local_130);
          pIVar6 = local_148;
          *(IntermediateNode **)local_20 = local_148;
          TVar10 = Node::top((Node *)CONCAT17(in_stack_fffffffffffffb07,
                                              CONCAT16(in_stack_fffffffffffffb06,
                                                       CONCAT15(in_stack_fffffffffffffb05,
                                                                CONCAT14(in_stack_fffffffffffffb04,
                                                                         in_stack_fffffffffffffb00))
                                                      )));
          local_190 = TVar10._inner._inner._0_8_;
          local_178 = CONCAT31(local_178._1_3_,TVar10._inner._inner._content[7]);
          local_164 = local_178;
          local_188 = local_178;
          local_180 = local_190;
          local_16c = local_190;
          iVar5 = (*(pIVar6->super_Node)._vptr_Node[10])
                            (pIVar6,local_190,(ulong)TVar10._inner._inner._content[7],1);
          local_160 = (undefined8 *)CONCAT44(extraout_var_00,iVar5);
          *local_160 = local_140;
        }
      }
      local_198 = *(long **)local_20;
      local_1c0._afterLast._4_4_ = (undefined4)local_198[2];
      pTVar8 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::get
                         ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                           *)in_stack_fffffffffffffaf0._content,in_stack_fffffffffffffaec);
      local_1c0._entries = (Entry *)pTVar8->_content;
      Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::remove
                (&local_1c0,(char *)local_10);
      Lib::Option<std::pair<unsigned_int,_Kernel::TermList>_>::~Option
                ((Option<std::pair<unsigned_int,_Kernel::TermList>_> *)0x4950ef);
      plVar1 = local_198;
      local_1c8 = local_20;
      TVar10 = Kernel::TermList::top((TermList *)in_stack_fffffffffffffb20);
      local_1f8 = TVar10._inner._inner._0_8_;
      local_1e0 = CONCAT31(local_1e0._1_3_,TVar10._inner._inner._content[7]);
      local_1cc = local_1e0;
      local_1f0 = local_1e0;
      local_1e8 = local_1f8;
      local_1d4 = local_1f8;
      local_20 = (uint *)(**(code **)(*plVar1 + 0x50))
                                   (plVar1,local_1f8,TVar10._inner._inner._content[7]);
      if (*(long *)local_20 == 0) {
        Lib::
        BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
        ::BinaryHeap(&local_210);
        Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::items
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                   in_stack_fffffffffffffb18);
        Lib::
        iterTraits<Lib::VirtualIterator<std::pair<unsigned_int_const&,Kernel::TermList_const&>>>
                  ((VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_> *)
                   in_stack_fffffffffffffb18);
        Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>::
        ~VirtualIterator((VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>
                          *)in_stack_fffffffffffffaf0._content);
        local_218 = local_220;
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::begin((IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
                 *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::end((IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
               *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        while( true ) {
          bVar3 = Lib::operator!=((StlIter *)in_stack_fffffffffffffaf0._content,
                                  (StlIter *)
                                  CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
          if (!bVar3) break;
          EVar12 = Lib::
                   IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
                   ::StlIter::operator*((StlIter *)0x49532d);
          local_278 = EVar12;
          local_280 = std::get<0ul,unsigned_int_const&,Kernel::TermList_const&>
                                ((pair<const_unsigned_int_&,_const_Kernel::TermList_&> *)0x495374);
          local_288 = std::get<1ul,unsigned_int_const&,Kernel::TermList_const&>
                                ((pair<const_unsigned_int_&,_const_Kernel::TermList_&> *)0x495389);
          local_2a0 = local_288->_content;
          Binding::Binding(&local_298,*local_280,(TermList)local_2a0);
          BVar13.term._content._0_4_ = in_stack_fffffffffffffb00;
          BVar13._0_8_ = in_stack_fffffffffffffaf8._content;
          BVar13.term._content._4_1_ = in_stack_fffffffffffffb04;
          BVar13.term._content._5_1_ = in_stack_fffffffffffffb05;
          BVar13.term._content._6_1_ = in_stack_fffffffffffffb06;
          BVar13.term._content._7_1_ = in_stack_fffffffffffffb07;
          Lib::
          BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
          ::insert((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                    *)in_stack_fffffffffffffaf0._content,BVar13);
          Lib::
          IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
          ::StlIter::operator++((StlIter *)in_stack_fffffffffffffb20);
        }
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::StlIter::~StlIter((StlIter *)0x49526a);
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::StlIter::~StlIter((StlIter *)0x495277);
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::~IterTraits((IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
                       *)0x495284);
        while( true ) {
          bVar3 = Lib::
                  BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                  ::isEmpty(&local_210);
          if (((bVar3 ^ 0xffU) & 1) == 0) break;
          BVar13 = Lib::
                   BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                   ::pop((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                          *)in_stack_fffffffffffffaf0._content);
          local_2a8 = (Entry *)BVar13.term._content;
          local_2b0 = BVar13.var;
          local_2c0 = local_1c0._entries;
          ts_01._content._7_1_ = in_stack_fffffffffffffb17;
          ts_01._content._0_7_ = in_stack_fffffffffffffb10;
          pIVar6 = createIntermediateNode(ts_01,(uint)((ulong)in_stack_fffffffffffffb08 >> 0x20));
          local_1c0._entries = local_2a8;
          *(IntermediateNode **)local_20 = pIVar6;
          local_2b8 = pIVar6;
          TVar10 = Kernel::TermList::top((TermList *)in_stack_fffffffffffffb20);
          local_2f0 = TVar10._inner._inner._0_8_;
          local_2d8 = CONCAT31(local_2d8._1_3_,TVar10._inner._inner._content[7]);
          local_2c8 = local_2d8;
          local_2e8 = local_2d8;
          local_2e0 = local_2f0;
          local_2d0 = local_2f0;
          iVar5 = (*(pIVar6->super_Node)._vptr_Node[10])(pIVar6,local_2f0,(ulong)local_2d8,1);
          local_20 = (uint *)CONCAT44(extraout_var_01,iVar5);
        }
        local_300 = local_1c0._entries;
        ts._content._4_1_ = in_stack_fffffffffffffb04;
        ts._content._0_4_ = in_stack_fffffffffffffb00;
        ts._content._5_1_ = in_stack_fffffffffffffb05;
        ts._content._6_1_ = in_stack_fffffffffffffb06;
        ts._content._7_1_ = in_stack_fffffffffffffb07;
        pLVar9 = createLeaf(ts);
        *(Leaf **)local_20 = pLVar9;
        local_2f8 = pLVar9;
        Inferences::ALASCA::SuperpositionConf::Lhs::Lhs
                  ((Lhs *)in_stack_fffffffffffffaf0._content,
                   (Lhs *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        (*(pLVar9->super_Node)._vptr_Node[9])(pLVar9,local_334);
        Inferences::ALASCA::SuperpositionConf::Lhs::~Lhs((Lhs *)0x49561a);
        ensureIntermediateNodeEfficiency((IntermediateNode **)0x495627);
        Lib::
        BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
        ::~BinaryHeap((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                       *)in_stack_fffffffffffffaf0._content);
        return;
      }
      local_340 = &local_1c0._entries;
      local_348 = Node::term(*(Node **)local_20);
      Lib::Stack<Kernel::TermList_*>::Stack
                ((Stack<Kernel::TermList_*> *)
                 CONCAT17(in_stack_fffffffffffffb07,
                          CONCAT16(in_stack_fffffffffffffb06,
                                   CONCAT15(in_stack_fffffffffffffb05,
                                            CONCAT14(in_stack_fffffffffffffb04,
                                                     in_stack_fffffffffffffb00)))),
                 in_stack_fffffffffffffaf8._content);
LAB_004956a8:
      while (bVar3 = Kernel::TermList::operator!=((TermList *)local_340,local_348), bVar3) {
        local_370 = local_348->_content;
        local_378 = *local_340;
        bVar3 = Kernel::TermList::sameTop(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
        if (!bVar3) break;
        in_stack_fffffffffffffb20 = Kernel::TermList::term((TermList *)0x495721);
        local_380 = in_stack_fffffffffffffb20;
        in_stack_fffffffffffffb18 = Kernel::TermList::term((TermList *)0x495742);
        local_388 = in_stack_fffffffffffffb18;
        in_stack_fffffffffffffb17 = Kernel::Term::shared((Term *)0x495763);
        if ((bool)in_stack_fffffffffffffb17) {
          in_stack_fffffffffffffb08 =
               Kernel::Term::cloneNonShared
                         ((Term *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10));
          local_380 = in_stack_fffffffffffffb08;
          Kernel::TermList::setTerm
                    ((TermList *)in_stack_fffffffffffffaf0._content,
                     (Term *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        }
        local_348 = Kernel::Term::args(local_380);
        local_340 = (Entry **)Kernel::Term::args(local_388);
        Kernel::TermList::next(local_348);
        in_stack_fffffffffffffb07 = Kernel::TermList::isEmpty((TermList *)0x495805);
        if (!(bool)in_stack_fffffffffffffb07) {
          Kernel::TermList::next(local_348);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffaf0._content,
                     (TermList *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
          Kernel::TermList::next((TermList *)local_340);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffaf0._content,
                     (TermList *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        }
      }
      local_390 = local_348->_content;
      local_398 = *local_340;
      in_stack_fffffffffffffb06 =
           Kernel::TermList::sameTop(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
      if (!(bool)in_stack_fffffffffffffb06) {
        in_stack_fffffffffffffb05 = Kernel::TermList::isSpecialVar((TermList *)0x4958b9);
        if ((bool)in_stack_fffffffffffffb05) {
          local_39c = Kernel::TermList::var(local_348);
        }
        else {
          local_39c = *in_RDI;
          *in_RDI = local_39c + 1;
          local_3b8 = local_348->_content;
          UnresolvedSplitRecord::UnresolvedSplitRecord(&local_3b0,local_39c,(TermList)local_3b8);
          obj.original._content._0_4_ = in_stack_fffffffffffffb00;
          obj._0_8_ = in_stack_fffffffffffffaf8._content;
          obj.original._content._4_1_ = in_stack_fffffffffffffb04;
          obj.original._content._5_1_ = in_stack_fffffffffffffb05;
          obj.original._content._6_1_ = in_stack_fffffffffffffb06;
          obj.original._content._7_1_ = in_stack_fffffffffffffb07;
          Lib::
          BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
          ::insert((BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                    *)in_stack_fffffffffffffaf0._content,obj);
          Kernel::TermList::makeSpecialVar(local_348,local_39c);
        }
        local_3c0 = *local_340;
        val._content._7_1_ = in_stack_fffffffffffffb17;
        val._content._0_7_ = in_stack_fffffffffffffb10;
        Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::set
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                   in_stack_fffffffffffffb08,
                   CONCAT13(in_stack_fffffffffffffb07,
                            CONCAT12(in_stack_fffffffffffffb06,
                                     CONCAT11(in_stack_fffffffffffffb05,in_stack_fffffffffffffb04)))
                   ,val);
      }
      bVar3 = Lib::Stack<Kernel::TermList_*>::isEmpty(&local_368);
      if (!bVar3) {
        in_stack_fffffffffffffaf8._content = (uint64_t)&local_368;
        local_340 = (Entry **)
                    Lib::Stack<Kernel::TermList_*>::pop
                              ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffaf8._content);
        local_348 = Lib::Stack<Kernel::TermList_*>::pop
                              ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffaf8._content);
        Kernel::TermList::next(local_348);
        in_stack_fffffffffffffb04 = Kernel::TermList::isEmpty((TermList *)0x4959e4);
        if (!(bool)in_stack_fffffffffffffb04) {
          Kernel::TermList::next(local_348);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffaf0._content,
                     (TermList *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
          Kernel::TermList::next((TermList *)local_340);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffaf0._content,
                     (TermList *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        }
        goto LAB_004956a8;
      }
      bVar3 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
              isEmpty(local_10);
      if (bVar3) {
        ensureLeafEfficiency((Leaf **)0x495a5e);
        in_stack_fffffffffffffaf0._content = *(uint64_t *)local_20;
        local_3c8 = (DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                    in_stack_fffffffffffffaf0._content;
        Inferences::ALASCA::SuperpositionConf::Lhs::Lhs
                  ((Lhs *)in_stack_fffffffffffffaf0._content,
                   (Lhs *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        (**(code **)(*(long *)in_stack_fffffffffffffaf0._content + 0x48))
                  (in_stack_fffffffffffffaf0._content,local_3fc);
        Inferences::ALASCA::SuperpositionConf::Lhs::~Lhs((Lhs *)0x495abc);
        local_400 = 1;
      }
      else {
        local_400 = 2;
      }
      Lib::Stack<Kernel::TermList_*>::~Stack
                ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffaf0._content);
    } while (local_400 != 1);
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::insert(BindingMap& svBindings, LeafData ld)
{
  ASS_EQ(_iterCnt,0);
  auto pnode = &_root;
  DEBUG_INSERT(0, "insert: ", svBindings, " into ", *this)

  if(*pnode == 0) {
    if (svBindings.isEmpty()) {
      auto leaf = createLeaf();
      leaf->insert(std::move(ld));
      *pnode = leaf;
      DEBUG_INSERT(0, "out: ", *this);
      return;
    } else {
      *pnode=createIntermediateNode(svBindings.getOneKey());
    }
  }
  if(svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    static_cast<Leaf*>(*pnode)->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  typedef BinaryHeap<UnresolvedSplitRecord, BindingComparator<LeafData_>> SplitRecordHeap;
  static SplitRecordHeap unresolvedSplits;
  unresolvedSplits.reset();

  ASS((*pnode));
  ASS(!(*pnode)->isLeaf());

start:

#if REORDERING
  ASS(!(*pnode)->isLeaf() || !unresolvedSplits.isEmpty());
  bool canPostponeSplits=false;
  if((*pnode)->isLeaf() || (*pnode)->algorithm()!=UNSORTED_LIST) {
    canPostponeSplits=false;
  } else {
    UArrIntermediateNode* inode = static_cast<UArrIntermediateNode*>(*pnode);
    canPostponeSplits = inode->size()==1;
    if(canPostponeSplits) {
      unsigned boundVar=inode->childVar;
      Node* child=inode->_nodes[0];
      bool removeProblematicNode=false;
      if(svBindings.find(boundVar)) {
	TermList term=svBindings.get(boundVar);
	bool wouldDescendIntoChild = inode->childByTop(term.top(),false)!=0;
	ASS_EQ(wouldDescendIntoChild, TermList::sameTop(term, child->term()));
	if(!wouldDescendIntoChild) {
	  //if we'd have to perform all postponed splitting due to
	  //node with a single child, we rather remove that node
	  //from the tree and deal with the binding, it represented,
	  //later.
	  removeProblematicNode=true;
	}
      } else if(!child->term().isTerm() || child->term().term()->shared()) {
	//We can remove nodes binding to special variables undefined in our branch
	//of the tree, as long as we're sure, that during split resolving we put these
	//binding nodes below nodes that define spec. variables they bind.
	removeProblematicNode=true;
      } else {
	canPostponeSplits = false;
      }
      if(removeProblematicNode) {
	unresolvedSplits.insert(UnresolvedSplitRecord(inode->childVar, child->term()));
	child->setTerm(inode->term());
	*pnode=child;
	inode->makeEmpty();
	delete inode;
	goto start;
      }
    }
  }
  canPostponeSplits|=unresolvedSplits.isEmpty();
  if(!canPostponeSplits) {

    while(!unresolvedSplits.isEmpty()) {
      UnresolvedSplitRecord urr=unresolvedSplits.pop();

      Node* node=*pnode;
      IntermediateNode* newNode = createIntermediateNode(node->term(), urr.var);
      node->setTerm(urr.original);

      *pnode=newNode;

      Node** nodePosition=newNode->childByTop(node->top(), true);
      ASS(!*nodePosition);
      *nodePosition=node;
    }
  }
#endif
  ASS(!(*pnode)->isLeaf());

  IntermediateNode* inode = static_cast<IntermediateNode*>(*pnode);
  ASS(inode);

  unsigned boundVar=inode->childVar;
  TermList term=svBindings.get(boundVar);
  svBindings.remove(boundVar);

  //Into pparent we store the node, we might be inserting into.
  //So in the case we do insert, we might check whether this node
  //needs expansion.
  Node** pparent=pnode;
  pnode=inode->childByTop(term.top(),true);

  if (*pnode == 0) {
    BinaryHeap<Binding, BindingComparator<LeafData_>> remainingBindings;
    for (auto [var, term] : iterTraits(svBindings.items())) {
      remainingBindings.insert(Binding(var, term));
    }
    while (!remainingBindings.isEmpty()) {
      Binding b=remainingBindings.pop();
      IntermediateNode* inode = createIntermediateNode(term, b.var);
      term=b.term;

      *pnode = inode;
      pnode = inode->childByTop(term.top(),true);
    }
    Leaf* lnode=createLeaf(term);
    *pnode=lnode;
    lnode->insert(ld);

    ensureIntermediateNodeEfficiency(reinterpret_cast<IntermediateNode**>(pparent));
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }


  TermList* tt = &term;
  TermList* ss = &(*pnode)->term();

  ASS(TermList::sameTop(*ss, *tt));


  // ss is the term in node, tt is the term to be inserted
  // ss and tt have the same top symbols but are not equal
  // create the common subterm of ss,tt and an alternative node
  Stack<TermList*> subterms(64);
  for (;;) {
    if (*tt!=*ss && TermList::sameTop(*ss,*tt)) {
      // ss and tt have the same tops and are different, so must be non-variables
      ASS(! ss->isVar());
      ASS(! tt->isVar());

      Term* s = ss->term();
      Term* t = tt->term();

      ASS(s->arity() > 0);
      ASS(s->functor() == t->functor());

      if (s->shared()) {
        // create a shallow copy of s
        s = Term::cloneNonShared(s);
        ss->setTerm(s);
      }

      ss = s->args();
      tt = t->args();
      if (ss->next()->isEmpty()) {
        continue;
      }
      subterms.push(ss->next());
      subterms.push(tt->next());
    } else {
      if (! TermList::sameTop(*ss,*tt)) {
        unsigned x;
        if(!ss->isSpecialVar()) {
          x = _nextVar++;
        #if REORDERING
          unresolvedSplits.insert(UnresolvedSplitRecord(x,*ss));
          ss->makeSpecialVar(x);
        #else
          Node::split(pnode,ss,x);
        #endif
        } else {
          x=ss->var();
        }
        svBindings.set(x,*tt);
      }

      if (subterms.isEmpty()) {
        break;
      }
      tt = subterms.pop();
      ss = subterms.pop();
      if (! ss->next()->isEmpty()) {
        subterms.push(ss->next());
        subterms.push(tt->next());
      }
    }
  }

  if (svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    Leaf* leaf = static_cast<Leaf*>(*pnode);
    leaf->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  goto start;
}